

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinFoodWeb_kry.c
# Opt level: O0

void PrintFinalStats(void *kmem)

{
  int iVar1;
  undefined8 in_RDI;
  int retval;
  long nfeSG;
  long ncfl;
  long nps;
  long npe;
  long nli;
  long nfe;
  long nni;
  char *in_stack_ffffffffffffffc0;
  void *in_stack_ffffffffffffffc8;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  undefined8 local_8;
  
  local_8 = in_RDI;
  iVar1 = KINGetNumNonlinSolvIters(in_RDI,&local_10);
  check_retval(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,iVar1);
  iVar1 = KINGetNumFuncEvals(local_8,&local_18);
  check_retval(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,iVar1);
  iVar1 = KINGetNumLinIters(local_8,&local_20);
  check_retval(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,iVar1);
  iVar1 = KINGetNumPrecEvals(local_8,&local_28);
  check_retval(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,iVar1);
  iVar1 = KINGetNumPrecSolves(local_8,&local_30);
  check_retval(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,iVar1);
  iVar1 = KINGetNumLinConvFails(local_8,&stack0xffffffffffffffc8);
  check_retval(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,iVar1);
  iVar1 = KINGetNumLinFuncEvals(local_8,&stack0xffffffffffffffc0);
  check_retval(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,iVar1);
  printf("Final Statistics.. \n");
  printf("nni    = %5ld    nli   = %5ld\n",local_10,local_20);
  printf("nfe    = %5ld    nfeSG = %5ld\n",local_18,in_stack_ffffffffffffffc0);
  printf("nps    = %5ld    npe   = %5ld     ncfl  = %5ld\n",local_30,local_28,
         in_stack_ffffffffffffffc8);
  return;
}

Assistant:

static void PrintFinalStats(void* kmem)
{
  long int nni, nfe, nli, npe, nps, ncfl, nfeSG;
  int retval;

  retval = KINGetNumNonlinSolvIters(kmem, &nni);
  check_retval(&retval, "KINGetNumNonlinSolvIters", 1);
  retval = KINGetNumFuncEvals(kmem, &nfe);
  check_retval(&retval, "KINGetNumFuncEvals", 1);
  retval = KINGetNumLinIters(kmem, &nli);
  check_retval(&retval, "KINGetNumLinIters", 1);
  retval = KINGetNumPrecEvals(kmem, &npe);
  check_retval(&retval, "KINGetNumPrecEvals", 1);
  retval = KINGetNumPrecSolves(kmem, &nps);
  check_retval(&retval, "KINGetNumPrecSolves", 1);
  retval = KINGetNumLinConvFails(kmem, &ncfl);
  check_retval(&retval, "KINGetNumLinConvFails", 1);
  retval = KINGetNumLinFuncEvals(kmem, &nfeSG);
  check_retval(&retval, "KINGetNumLinFuncEvals", 1);

  printf("Final Statistics.. \n");
  printf("nni    = %5ld    nli   = %5ld\n", nni, nli);
  printf("nfe    = %5ld    nfeSG = %5ld\n", nfe, nfeSG);
  printf("nps    = %5ld    npe   = %5ld     ncfl  = %5ld\n", nps, npe, ncfl);
}